

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O2

ssize_t __thiscall
ritobin::io::impl_binary_write::BinaryWriter::write
          (BinaryWriter *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  undefined4 in_register_00000034;
  uint8_t raw;
  
  uVar1 = (**(code **)(*(long *)this->compat_ + 8))
                    (this->compat_,CONCAT44(in_register_00000034,__fd));
  if ((char)uVar1 != '\0') {
    write<unsigned_char>(this,'\0');
  }
  return (ulong)uVar1;
}

Assistant:

[[nodiscard]] bool write(Type type) noexcept {
            uint8_t raw = 0;
            if (compat_->type_to_raw(type, raw)) {
                write(raw);
                return true;
            } else {
                return false;
            }
        }